

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bdelete(bstring b,int pos,int len)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uchar *__dest;
  uint uVar6;
  
  uVar3 = 0;
  if (0 < pos) {
    uVar3 = (ulong)(uint)pos;
  }
  iVar2 = (int)uVar3;
  iVar5 = 0;
  if (pos < 0) {
    iVar5 = pos;
  }
  uVar6 = iVar5 + len;
  iVar5 = -1;
  if ((((b != (bstring)0x0 && -1 < (int)uVar6) && (b->data != (uchar *)0x0)) &&
      (iVar1 = b->slen, -1 < iVar1)) && (0 < b->mlen && iVar1 <= b->mlen)) {
    iVar5 = 0;
    if (iVar2 < iVar1 && 0 < (int)uVar6) {
      iVar5 = uVar6 + iVar2;
      uVar4 = iVar1 - iVar5;
      if (uVar4 != 0 && iVar5 <= iVar1) {
        if (uVar4 != 0 && iVar5 <= iVar1) {
          __dest = b->data + uVar3;
          memmove(__dest,__dest + uVar6,(ulong)uVar4);
        }
        iVar2 = b->slen - uVar6;
      }
      b->slen = iVar2;
      b->data[iVar2] = '\0';
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int bdelete (bstring b, int pos, int len) {
	/* Clamp to left side of bstring */
	if (pos < 0) {
		len += pos;
		pos = 0;
	}

	if (len < 0 || b == NULL || b->data == NULL || b->slen < 0 ||
	    b->mlen < b->slen || b->mlen <= 0)
		return BSTR_ERR;
	if (len > 0 && pos < b->slen) {
		if (pos + len >= b->slen) {
			b->slen = pos;
		} else {
			bBlockCopy ((char *) (b->data + pos),
			            (char *) (b->data + pos + len),
			            b->slen - (pos+len));
			b->slen -= len;
		}
		b->data[b->slen] = (unsigned char) '\0';
	}
	return BSTR_OK;
}